

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::GreaterEqualLayerParams::_InternalParse
          (GreaterEqualLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *pfVar4;
  uint res;
  pair<const_char_*,_unsigned_int> pVar5;
  float *local_30;
  
  local_30 = (float *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_30;
      res = (uint)bVar1;
      pfVar4 = (float *)((long)local_30 + 1);
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*(byte *)pfVar4 * 0x80) - 0x80;
        if ((char)*(byte *)pfVar4 < '\0') {
          pVar5 = google::protobuf::internal::ReadTagFallback((char *)local_30,res);
          pfVar4 = (float *)pVar5.first;
          res = pVar5.second;
        }
        else {
          pfVar4 = (float *)((long)local_30 + 2);
        }
      }
      if (res == 0x15) {
        this->alpha_ = *pfVar4;
        local_30 = pfVar4 + 1;
      }
      else {
        if ((res == 0) || ((res & 7) == 4)) {
          if (pfVar4 == (float *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pfVar4;
        }
        uVar2 = this_00->ptr_;
        local_30 = pfVar4;
        if ((uVar2 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar2 & 0xfffffffffffffffc) + 8);
        }
        local_30 = (float *)google::protobuf::internal::UnknownFieldParse
                                      (res,unknown,(char *)local_30,ctx);
        if (local_30 == (float *)0x0) {
          return (char *)0x0;
        }
      }
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_30;
}

Assistant:

const char* GreaterEqualLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // float alpha = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          alpha_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}